

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

CPChar cp_get_bs(CPState *cp)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  byte *pbVar5;
  
  do {
    pcVar4 = cp->p;
    cVar1 = *pcVar4;
    if ((cVar1 != '\n') && (cVar1 != '\r')) {
      return cp->c;
    }
    cp->p = pcVar4 + 1;
    cVar2 = pcVar4[1];
    if ((cVar2 != cVar1) && (cVar2 == '\n' || cVar2 == '\r')) {
      cp->p = pcVar4 + 2;
    }
    cp->linenumber = cp->linenumber + 1;
    pbVar5 = (byte *)cp->p;
    cp->p = (char *)(pbVar5 + 1);
    bVar3 = *pbVar5;
    cp->c = (uint)bVar3;
  } while (bVar3 == 0x5c);
  return (CPChar)bVar3;
}

Assistant:

static LJ_NOINLINE CPChar cp_get_bs(CPState *cp)
{
  CPChar c2, c = cp_rawpeek(cp);
  if (!cp_iseol(c)) return cp->c;
  cp->p++;
  c2 = cp_rawpeek(cp);
  if (cp_iseol(c2) && c2 != c) cp->p++;
  cp->linenumber++;
  return cp_get(cp);
}